

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_pack(REF_CELL ref_cell,REF_INT *o2n)

{
  REF_STATUS RVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  REF_INT *pRVar5;
  REF_INT *sorted_index;
  void *__ptr;
  REF_INT RVar6;
  ulong uVar7;
  undefined8 uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  uint uVar14;
  REF_INT nodes [27];
  
  uVar14 = 0;
  iVar9 = 0;
  while( true ) {
    iVar3 = ref_cell->max;
    if (iVar3 <= iVar9) break;
    RVar1 = ref_cell_nodes(ref_cell,iVar9,nodes);
    if (RVar1 == 0) {
      lVar4 = 0;
      while( true ) {
        iVar3 = ref_cell->node_per;
        if (iVar3 <= lVar4) break;
        ref_cell->c2n[(long)ref_cell->size_per * (long)(int)uVar14 + lVar4] = o2n[nodes[lVar4]];
        lVar4 = lVar4 + 1;
      }
      if (ref_cell->last_node_is_an_id != 0) {
        ref_cell->c2n[(int)(ref_cell->size_per * uVar14 + iVar3)] = nodes[iVar3];
      }
      uVar14 = uVar14 + 1;
    }
    iVar9 = iVar9 + 1;
  }
  if (uVar14 == ref_cell->n) {
    if ((int)uVar14 < iVar3) {
      pRVar5 = ref_cell->c2n;
      while ((int)uVar14 < iVar3) {
        pRVar5[(int)(ref_cell->size_per * uVar14)] = -1;
        lVar4 = (long)(int)uVar14;
        uVar14 = uVar14 + 1;
        pRVar5[lVar4 * ref_cell->size_per + 1] = uVar14;
        iVar3 = ref_cell->max;
      }
      pRVar5[(long)(ref_cell->size_per * (iVar3 + -1)) + 1] = -1;
      uVar14 = ref_cell->n;
      uVar2 = uVar14;
    }
    else {
      uVar2 = 0xffffffff;
    }
    ref_cell->blank = uVar2;
    if ((int)uVar14 < 0) {
      pcVar12 = "malloc key of REF_INT negative";
      uVar8 = 0x218;
    }
    else {
      pRVar5 = (REF_INT *)malloc((ulong)uVar14 << 2);
      if (pRVar5 == (REF_INT *)0x0) {
        pcVar12 = "malloc key of REF_INT NULL";
        uVar8 = 0x218;
LAB_001c2cff:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               uVar8,"ref_cell_pack",pcVar12);
        return 2;
      }
      sorted_index = (REF_INT *)malloc((ulong)uVar14 << 2);
      if (sorted_index == (REF_INT *)0x0) {
        pcVar12 = "malloc order of REF_INT NULL";
        uVar8 = 0x219;
        goto LAB_001c2cff;
      }
      uVar2 = ref_cell->size_per * uVar14;
      if (-1 < (int)uVar2) {
        __ptr = malloc((ulong)uVar2 << 2);
        if (__ptr != (void *)0x0) {
          uVar10 = 0;
          uVar7 = (ulong)(uint)ref_cell->max;
          if (ref_cell->max < 1) {
            uVar7 = uVar10;
          }
          for (; uVar10 != uVar7; uVar10 = uVar10 + 1) {
            RVar1 = ref_cell_nodes(ref_cell,(REF_INT)uVar10,nodes);
            if (RVar1 == 0) {
              pRVar5[uVar10] = nodes[0];
              iVar9 = ref_cell->node_per;
              RVar6 = nodes[0];
              for (lVar4 = 1; lVar4 < iVar9; lVar4 = lVar4 + 1) {
                iVar3 = nodes[lVar4];
                if (iVar3 < RVar6) {
                  pRVar5[uVar10] = iVar3;
                  RVar6 = iVar3;
                }
              }
            }
          }
          uVar14 = ref_sort_heap_int(uVar14,pRVar5,sorted_index);
          if (uVar14 == 0) {
            uVar14 = ref_cell->n;
            uVar7 = 0;
            uVar10 = 0;
            if (0 < (int)uVar14) {
              uVar10 = (ulong)uVar14;
            }
            for (; uVar7 != uVar10; uVar7 = uVar7 + 1) {
              uVar2 = ref_cell->size_per;
              uVar11 = 0;
              if (0 < (int)uVar2) {
                uVar11 = (ulong)uVar2;
              }
              for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
                *(REF_INT *)((long)__ptr + uVar13 * 4 + (long)(int)((int)uVar7 * uVar2) * 4) =
                     ref_cell->c2n[(long)sorted_index[uVar7] * (long)(int)uVar2 + uVar13];
              }
            }
            for (iVar9 = 0; iVar9 < (int)uVar14; iVar9 = iVar9 + 1) {
              for (iVar3 = 0; iVar3 < ref_cell->size_per; iVar3 = iVar3 + 1) {
                lVar4 = (long)(ref_cell->size_per * iVar9 + iVar3);
                ref_cell->c2n[lVar4] = *(REF_INT *)((long)__ptr + lVar4 * 4);
              }
              uVar14 = ref_cell->n;
            }
            free(__ptr);
            free(sorted_index);
            free(pRVar5);
            uVar14 = ref_adj_free(ref_cell->ref_adj);
            if (uVar14 == 0) {
              uVar14 = ref_adj_create(&ref_cell->ref_adj);
              if (uVar14 == 0) {
                iVar9 = 0;
                do {
                  if (ref_cell->n <= iVar9) {
                    return 0;
                  }
                  lVar4 = 0;
                  while ((int)lVar4 < ref_cell->node_per) {
                    uVar14 = ref_adj_add(ref_cell->ref_adj,
                                         ref_cell->c2n
                                         [(long)ref_cell->size_per * (long)iVar9 + lVar4],iVar9);
                    lVar4 = lVar4 + 1;
                    if (uVar14 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                             ,0x23b,"ref_cell_pack",(ulong)uVar14,"register cell");
                      return uVar14;
                    }
                  }
                  iVar9 = iVar9 + 1;
                } while( true );
              }
              uVar7 = (ulong)uVar14;
              pcVar12 = "fresh ref_adj for ref_cell";
              uVar8 = 0x235;
            }
            else {
              uVar7 = (ulong)uVar14;
              pcVar12 = "free adj";
              uVar8 = 0x234;
            }
          }
          else {
            uVar7 = (ulong)uVar14;
            pcVar12 = "sort smallest";
            uVar8 = 0x222;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 uVar8,"ref_cell_pack",uVar7,pcVar12);
          return (REF_STATUS)uVar7;
        }
        pcVar12 = "malloc c2n of REF_INT NULL";
        uVar8 = 0x21b;
        goto LAB_001c2cff;
      }
      pcVar12 = "malloc c2n of REF_INT negative";
      uVar8 = 0x21b;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar8,
           "ref_cell_pack",pcVar12);
  }
  else {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x209,
           "ref_cell_pack","count is off",(long)(int)uVar14,(long)ref_cell->n);
  }
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_pack(REF_CELL ref_cell, REF_INT *o2n) {
  REF_INT node, cell, compact;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  compact = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      ref_cell_c2n(ref_cell, node, compact) = o2n[nodes[node]];
    if (ref_cell_last_node_is_an_id(ref_cell))
      ref_cell_c2n(ref_cell, ref_cell_node_per(ref_cell), compact) =
          nodes[ref_cell_node_per(ref_cell)];
    compact++;
  }
  REIS(compact, ref_cell_n(ref_cell), "count is off");

  if (ref_cell_n(ref_cell) < ref_cell_max(ref_cell)) {
    for (cell = ref_cell_n(ref_cell); cell < ref_cell_max(ref_cell); cell++) {
      ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
      ref_cell_c2n(ref_cell, 1, cell) = cell + 1;
    }
    ref_cell_c2n(ref_cell, 1, ref_cell_max(ref_cell) - 1) = REF_EMPTY;
    ref_cell_blank(ref_cell) = ref_cell_n(ref_cell);
  } else {
    ref_cell_blank(ref_cell) = REF_EMPTY;
  }

  {
    REF_INT *key, *order, *c2n;
    ref_malloc(key, ref_cell_n(ref_cell), REF_INT);
    ref_malloc(order, ref_cell_n(ref_cell), REF_INT);
    ref_malloc(c2n, ref_cell_size_per(ref_cell) * ref_cell_n(ref_cell),
               REF_INT);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      key[cell] = nodes[0];
      for (node = 1; node < ref_cell_node_per(ref_cell); node++) {
        if (nodes[node] < key[cell]) key[cell] = nodes[node];
      }
    }
    RSS(ref_sort_heap_int(ref_cell_n(ref_cell), key, order), "sort smallest");
    for (cell = 0; cell < ref_cell_n(ref_cell); cell++) {
      for (node = 0; node < ref_cell_size_per(ref_cell); node++) {
        c2n[node + cell * ref_cell_size_per(ref_cell)] =
            ref_cell_c2n(ref_cell, node, order[cell]);
      }
    }
    for (cell = 0; cell < ref_cell_n(ref_cell); cell++) {
      for (node = 0; node < ref_cell_size_per(ref_cell); node++) {
        ref_cell_c2n(ref_cell, node, cell) =
            c2n[node + cell * ref_cell_size_per(ref_cell)];
      }
    }
    ref_free(c2n);
    ref_free(order);
    ref_free(key);
  }

  RSS(ref_adj_free(ref_cell_adj(ref_cell)), "free adj");
  RSS(ref_adj_create(&(ref_cell->ref_adj)), "fresh ref_adj for ref_cell");

  for (cell = 0; cell < ref_cell_n(ref_cell); cell++)
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      RSS(ref_adj_add(ref_cell_adj(ref_cell),
                      ref_cell_c2n(ref_cell, node, cell), cell),
          "register cell");

  return REF_SUCCESS;
}